

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

int __thiscall
leveldb::MemTable::KeyComparator::operator()(KeyComparator *this,char *aptr,char *bptr)

{
  int iVar1;
  char *pcVar2;
  Slice a;
  Slice b;
  Slice local_38;
  Slice local_28;
  
  if (*aptr < '\0') {
    pcVar2 = GetVarint32PtrFallback(aptr,aptr + 5,(uint32_t *)&local_38);
  }
  else {
    pcVar2 = aptr + 1;
    local_38.data_._0_4_ = (int)*aptr;
  }
  local_38.size_ = (size_t)(uint)local_38.data_;
  local_38.data_ = pcVar2;
  if (*bptr < '\0') {
    pcVar2 = GetVarint32PtrFallback(bptr,bptr + 5,(uint32_t *)&local_28);
  }
  else {
    pcVar2 = bptr + 1;
    local_28.data_._0_4_ = (int)*bptr;
  }
  local_28.size_ = (size_t)(uint)local_28.data_;
  local_28.data_ = pcVar2;
  iVar1 = InternalKeyComparator::Compare(&this->comparator,&local_38,&local_28);
  return iVar1;
}

Assistant:

int MemTable::KeyComparator::operator()(const char *aptr, const char *bptr)
    const {
        // Internal keys are encoded as length-prefixed strings.
        Slice a = GetLengthPrefixedSlice(aptr);
        Slice b = GetLengthPrefixedSlice(bptr);
        return comparator.Compare(a, b);
    }